

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_quantize_intrin_sse2.c
# Opt level: O3

void aom_highbd_quantize_b_32x32_sse2
               (tran_low_t *coeff_ptr,intptr_t n_coeffs,int16_t *zbin_ptr,int16_t *round_ptr,
               int16_t *quant_ptr,int16_t *quant_shift_ptr,tran_low_t *qcoeff_ptr,
               tran_low_t *dqcoeff_ptr,int16_t *dequant_ptr,uint16_t *eob_ptr,int16_t *scan,
               int16_t *iscan)

{
  int *piVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  ushort uVar8;
  ushort uVar9;
  uint uVar10;
  undefined1 auVar11 [12];
  long lVar12;
  uint uVar13;
  int iVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  uint uVar19;
  int iVar20;
  short sVar22;
  undefined1 auVar21 [16];
  undefined1 auVar23 [16];
  int idx_arr [1024];
  int local_1078 [4];
  int local_1068;
  int iStack_1064;
  int iStack_1060;
  int iStack_105c;
  int local_1058 [4];
  int local_1048;
  int iStack_1044;
  int iStack_1040;
  int iStack_103c;
  int aiStack_1038 [1026];
  
  auVar23 = psraw(ZEXT416(*(uint *)zbin_ptr),1);
  auVar21 = ZEXT416(*(uint *)zbin_ptr) & _DAT_0050d550;
  sVar22 = auVar21._2_2_ + auVar23._2_2_;
  auVar11._4_8_ =
       (long)(((unkuint10)
               (uint6)(((unkuint10)CONCAT22(auVar23._6_2_,auVar23._6_2_) << 0x30) >> 0x20) << 0x20)
             >> 0x10);
  auVar11._2_2_ = sVar22;
  auVar11._0_2_ = sVar22;
  local_1058[0] = (int)(short)(auVar21._0_2_ + auVar23._0_2_);
  local_1058[1] = auVar11._0_4_ >> 0x10;
  local_1078[0] = -local_1058[0];
  local_1078[1] = -local_1058[1];
  local_1078[2] = -local_1058[1];
  local_1078[3] = -local_1058[1];
  local_1068 = -local_1058[1];
  iStack_1064 = -local_1058[1];
  iStack_1060 = -local_1058[1];
  iStack_105c = -local_1058[1];
  uVar13 = 0;
  local_1058[2] = local_1058[1];
  local_1058[3] = local_1058[1];
  local_1048 = local_1058[1];
  iStack_1044 = local_1058[1];
  iStack_1040 = local_1058[1];
  iStack_103c = local_1058[1];
  memset(qcoeff_ptr,0,n_coeffs * 4);
  memset(dqcoeff_ptr,0,n_coeffs * 4);
  lVar12 = n_coeffs + 3;
  if (-1 < n_coeffs) {
    lVar12 = n_coeffs;
  }
  if (3 < n_coeffs) {
    lVar12 = lVar12 >> 2;
    lVar15 = 0;
    do {
      piVar1 = coeff_ptr + lVar15;
      uVar16 = (ulong)(lVar15 != 0);
      auVar23._0_4_ = -(uint)(*piVar1 < local_1058[uVar16 * 4]);
      auVar23._4_4_ = -(uint)(piVar1[1] < local_1058[uVar16 * 4 + 1]);
      auVar23._8_4_ = -(uint)(piVar1[2] < local_1058[uVar16 * 4 + 2]);
      auVar23._12_4_ = -(uint)(piVar1[3] < local_1058[uVar16 * 4 + 3]);
      auVar21._0_4_ = -(uint)(local_1078[uVar16 * 4] < *piVar1);
      auVar21._4_4_ = -(uint)(local_1078[uVar16 * 4 + 1] < piVar1[1]);
      auVar21._8_4_ = -(uint)(local_1078[uVar16 * 4 + 2] < piVar1[2]);
      auVar21._12_4_ = -(uint)(local_1078[uVar16 * 4 + 3] < piVar1[3]);
      auVar21 = auVar21 & auVar23;
      uVar2 = (ushort)(SUB161(auVar21 >> 7,0) & 1) | (ushort)(SUB161(auVar21 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar21 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar21 >> 0x1f,0) & 1) << 3;
      uVar3 = (ushort)(SUB161(auVar21 >> 0x27,0) & 1);
      uVar4 = (ushort)(SUB161(auVar21 >> 0x2f,0) & 1);
      uVar5 = (ushort)(SUB161(auVar21 >> 0x37,0) & 1);
      uVar6 = (ushort)(SUB161(auVar21 >> 0x3f,0) & 1);
      uVar7 = (ushort)(SUB161(auVar21 >> 0x4f,0) & 1);
      uVar8 = (ushort)(SUB161(auVar21 >> 0x57,0) & 1);
      uVar9 = (ushort)(SUB161(auVar21 >> 0x5f,0) & 1);
      iVar14 = (int)lVar15;
      if (uVar2 == 0) {
        lVar17 = (long)(int)uVar13;
        uVar13 = uVar13 + 1;
        aiStack_1038[lVar17] = iVar14;
      }
      if (((uVar3 == 0 && uVar4 == 0) && uVar5 == 0) && uVar6 == 0) {
        lVar17 = (long)(int)uVar13;
        uVar13 = uVar13 + 1;
        aiStack_1038[lVar17] = iVar14 + 1;
      }
      if ((((auVar21 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0 && uVar7 == 0) &&
          uVar8 == 0) && uVar9 == 0) {
        lVar17 = (long)(int)uVar13;
        uVar13 = uVar13 + 1;
        aiStack_1038[lVar17] = iVar14 + 2;
      }
      if ((ushort)(uVar2 | uVar3 << 4 | uVar4 << 5 | uVar5 << 6 | uVar6 << 7 |
                   (ushort)(SUB161(auVar21 >> 0x47,0) & 1) << 8 | uVar7 << 9 | uVar8 << 10 |
                   uVar9 << 0xb | (ushort)(SUB161(auVar21 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar21 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar21 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar21[0xf] >> 7) << 0xf) < 0x1000) {
        lVar17 = (long)(int)uVar13;
        uVar13 = uVar13 + 1;
        aiStack_1038[lVar17] = iVar14 + 3;
      }
      lVar15 = lVar15 + 4;
      lVar12 = lVar12 + -1;
    } while (lVar12 != 0);
    if ((int)uVar13 < 1) {
      uVar13 = 0;
    }
    else {
      iVar14 = -1;
      uVar16 = 0;
      do {
        lVar12 = (long)aiStack_1038[uVar16];
        uVar10 = coeff_ptr[lVar12] >> 0x1f;
        uVar18 = (ulong)((uint)(lVar12 != 0) * 2);
        lVar15 = (long)(int)((*(short *)((long)round_ptr + uVar18) + 1 >> 1) +
                            ((coeff_ptr[lVar12] ^ uVar10) - uVar10));
        uVar19 = (uint)((long)*(short *)((long)quant_shift_ptr + uVar18) *
                        (((ulong)(*(short *)((long)quant_ptr + uVar18) * lVar15) >> 0x10) + lVar15)
                       >> 0xf);
        iVar20 = (uVar10 ^ uVar19) - uVar10;
        qcoeff_ptr[lVar12] = iVar20;
        dqcoeff_ptr[lVar12] = (*(short *)((long)dequant_ptr + uVar18) * iVar20) / 2;
        if (uVar19 != 0) {
          if (iVar14 <= iscan[lVar12]) {
            iVar14 = (int)iscan[lVar12];
          }
        }
        uVar16 = uVar16 + 1;
      } while (uVar13 != uVar16);
      uVar13 = iVar14 + 1;
    }
  }
  *eob_ptr = (uint16_t)uVar13;
  return;
}

Assistant:

void aom_highbd_quantize_b_32x32_sse2(
    const tran_low_t *coeff_ptr, intptr_t n_coeffs, const int16_t *zbin_ptr,
    const int16_t *round_ptr, const int16_t *quant_ptr,
    const int16_t *quant_shift_ptr, tran_low_t *qcoeff_ptr,
    tran_low_t *dqcoeff_ptr, const int16_t *dequant_ptr, uint16_t *eob_ptr,
    const int16_t *scan, const int16_t *iscan) {
  __m128i zbins[2];
  __m128i nzbins[2];
  int idx = 0;
  int idx_arr[1024];
  int i, eob = -1;
  const int zbin0_tmp = ROUND_POWER_OF_TWO(zbin_ptr[0], 1);
  const int zbin1_tmp = ROUND_POWER_OF_TWO(zbin_ptr[1], 1);
  (void)scan;
  zbins[0] = _mm_set_epi32(zbin1_tmp, zbin1_tmp, zbin1_tmp, zbin0_tmp);
  zbins[1] = _mm_set1_epi32(zbin1_tmp);

  nzbins[0] = _mm_setzero_si128();
  nzbins[1] = _mm_setzero_si128();
  nzbins[0] = _mm_sub_epi32(nzbins[0], zbins[0]);
  nzbins[1] = _mm_sub_epi32(nzbins[1], zbins[1]);

  memset(qcoeff_ptr, 0, n_coeffs * sizeof(*qcoeff_ptr));
  memset(dqcoeff_ptr, 0, n_coeffs * sizeof(*dqcoeff_ptr));

  // Pre-scan pass
  for (i = 0; i < n_coeffs / 4; i++) {
    __m128i coeffs, cmp1, cmp2;
    int test;
    coeffs = _mm_load_si128((const __m128i *)(coeff_ptr + i * 4));
    cmp1 = _mm_cmplt_epi32(coeffs, zbins[i != 0]);
    cmp2 = _mm_cmpgt_epi32(coeffs, nzbins[i != 0]);
    cmp1 = _mm_and_si128(cmp1, cmp2);
    test = _mm_movemask_epi8(cmp1);
    if (!(test & 0xf)) idx_arr[idx++] = i * 4;
    if (!(test & 0xf0)) idx_arr[idx++] = i * 4 + 1;
    if (!(test & 0xf00)) idx_arr[idx++] = i * 4 + 2;
    if (!(test & 0xf000)) idx_arr[idx++] = i * 4 + 3;
  }

  // Quantization pass: only process the coefficients selected in
  // pre-scan pass. Note: idx can be zero.
  for (i = 0; i < idx; i++) {
    const int rc = idx_arr[i];
    const int coeff = coeff_ptr[rc];
    const int coeff_sign = AOMSIGN(coeff);
    const int abs_coeff = (coeff ^ coeff_sign) - coeff_sign;
    const int64_t tmp1 = abs_coeff + ROUND_POWER_OF_TWO(round_ptr[rc != 0], 1);
    const int64_t tmp2 = ((tmp1 * quant_ptr[rc != 0]) >> 16) + tmp1;
    const uint32_t abs_qcoeff =
        (uint32_t)((tmp2 * quant_shift_ptr[rc != 0]) >> 15);
    qcoeff_ptr[rc] = (int)(abs_qcoeff ^ (uint32_t)coeff_sign) - coeff_sign;
    dqcoeff_ptr[rc] = qcoeff_ptr[rc] * dequant_ptr[rc != 0] / 2;
    if (abs_qcoeff) eob = iscan[idx_arr[i]] > eob ? iscan[idx_arr[i]] : eob;
  }
  *eob_ptr = eob + 1;
}